

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cpp
# Opt level: O2

void Assert::throwif(bool b,string *message)

{
  ostream *poVar1;
  undefined8 uVar2;
  undefined7 in_register_00000039;
  ostringstream buf;
  
  if ((int)CONCAT71(in_register_00000039,b) == 0) {
    unit_test_runner.passed = unit_test_runner.passed + 1;
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&buf,_S_out);
  poVar1 = std::operator<<((ostream *)&buf,"Assert error: ");
  std::operator<<(poVar1,(string *)message);
  uVar2 = __cxa_allocate_exception(0x20);
  std::__cxx11::stringbuf::str();
  __cxa_throw(uVar2,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void Assert::throwif(bool b, const string &message)
{
    if (b) {
        std::ostringstream buf(std::ostringstream::out);
        buf << "Assert error: " << message;
        throw buf.str();
    }
    ++unit_test_runner.passed;
}